

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec3.cpp
# Opt level: O2

bool refract(Vec3 *vector,Vec3 *normal,float ni_over_nt,Vec3 *refracted)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float __x;
  Vec3 _uv;
  undefined8 local_28;
  float local_20;
  
  unit_vector(vector);
  fVar5 = (float)((ulong)local_28 >> 0x20);
  fVar6 = (float)*(undefined8 *)normal->e;
  fVar7 = (float)((ulong)*(undefined8 *)normal->e >> 0x20);
  fVar1 = normal->e[2];
  fVar4 = local_20 * fVar1 + (float)local_28 * fVar6 + fVar5 * fVar7;
  __x = 1.0 - ni_over_nt * ni_over_nt * (1.0 - fVar4 * fVar4);
  if (0.0 < __x) {
    if (__x < 0.0) {
      fVar3 = sqrtf(__x);
    }
    else {
      fVar3 = SQRT(__x);
    }
    fVar2 = normal->e[2];
    *(ulong *)refracted->e =
         CONCAT44(ni_over_nt * (fVar5 - fVar7 * fVar4) -
                  fVar3 * (float)((ulong)*(undefined8 *)normal->e >> 0x20),
                  ni_over_nt * ((float)local_28 - fVar6 * fVar4) -
                  fVar3 * (float)*(undefined8 *)normal->e);
    refracted->e[2] = (local_20 - fVar1 * fVar4) * ni_over_nt - fVar2 * fVar3;
  }
  return 0.0 < __x;
}

Assistant:

bool
refract(const Vec3& vector, const Vec3& normal, float ni_over_nt, Vec3& refracted)
{
    Vec3  _uv           = unit_vector(vector);
    float _dt           = dot(_uv, normal);
    float _discriminant = 1.0f - ni_over_nt*ni_over_nt*(1.0f-_dt*_dt);

    if (_discriminant > 0.0f) {
        refracted = ni_over_nt*(_uv - normal*_dt) - normal*sqrt(_discriminant);
        return true;
    }
    return false;
}